

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void sglr::depthValueFloatClampCopy(PixelBufferAccess *dst,ConstPixelBufferAccess *src)

{
  int iVar1;
  int stencil;
  int iVar2;
  int z;
  int iVar3;
  int x;
  int iVar4;
  int iVar5;
  int y;
  int iVar6;
  float fVar7;
  float fVar8;
  
  iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
  iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  iVar3 = 0;
  if (((src->m_format).order == DS) &&
     (iVar3 = 0, (dst->super_ConstPixelBufferAccess).m_format.order == DS)) {
    for (iVar3 = 0; iVar3 != iVar2; iVar3 = iVar3 + 1) {
      for (iVar6 = 0; iVar6 != iVar1; iVar6 = iVar6 + 1) {
        for (iVar4 = 0; iVar5 != iVar4; iVar4 = iVar4 + 1) {
          fVar7 = tcu::ConstPixelBufferAccess::getPixDepth(src,iVar4,iVar6,iVar3);
          fVar8 = 1.0;
          if (fVar7 <= 1.0) {
            fVar8 = fVar7;
          }
          tcu::PixelBufferAccess::setPixDepth
                    (dst,(float)(~-(uint)(fVar7 < 0.0) & (uint)fVar8),iVar4,iVar6,iVar3);
          stencil = tcu::ConstPixelBufferAccess::getPixStencil(src,iVar4,iVar6,iVar3);
          tcu::PixelBufferAccess::setPixStencil(dst,stencil,iVar4,iVar6,iVar3);
        }
      }
    }
  }
  else {
    for (; iVar3 != iVar2; iVar3 = iVar3 + 1) {
      for (iVar6 = 0; iVar6 != iVar1; iVar6 = iVar6 + 1) {
        for (iVar4 = 0; iVar5 != iVar4; iVar4 = iVar4 + 1) {
          fVar7 = tcu::ConstPixelBufferAccess::getPixDepth(src,iVar4,iVar6,iVar3);
          fVar8 = 1.0;
          if (fVar7 <= 1.0) {
            fVar8 = fVar7;
          }
          tcu::PixelBufferAccess::setPixDepth
                    (dst,(float)(~-(uint)(fVar7 < 0.0) & (uint)fVar8),iVar4,iVar6,iVar3);
        }
      }
    }
  }
  return;
}

Assistant:

static void depthValueFloatClampCopy (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src)
{
	int width	= dst.getWidth();
	int height	= dst.getHeight();
	int depth	= dst.getDepth();

	DE_ASSERT(src.getWidth() == width && src.getHeight() == height && src.getDepth() == depth);

	// clamping copy

	if (src.getFormat().order == tcu::TextureFormat::DS && dst.getFormat().order == tcu::TextureFormat::DS)
	{
		// copy only depth and stencil
		for (int z = 0; z < depth; z++)
		for (int y = 0; y < height; y++)
		for (int x = 0; x < width; x++)
		{
			dst.setPixDepth(de::clamp(src.getPixDepth(x, y, z), 0.0f, 1.0f), x, y, z);
			dst.setPixStencil(src.getPixStencil(x, y, z), x, y, z);
		}
	}
	else
	{
		// copy only depth
		for (int z = 0; z < depth; z++)
		for (int y = 0; y < height; y++)
		for (int x = 0; x < width; x++)
			dst.setPixDepth(de::clamp(src.getPixDepth(x, y, z), 0.0f, 1.0f), x, y, z);
	}
}